

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointRecord1.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::PointRecord1::Encode(PointRecord1 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  (*(this->m_Location).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Location,stream);
  return;
}

Assistant:

void PointRecord1::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_Location;
}